

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ffs.cpp
# Opt level: O0

int __thiscall libtorrent::aux::count_leading_zeros_sw(aux *this,span<const_unsigned_int> buf)

{
  uint32_t v;
  int iVar1;
  index_type iVar2;
  uint *puVar3;
  int local_34;
  int i;
  uint32_t *ptr;
  undefined1 auStack_20 [4];
  int num;
  span<const_unsigned_int> buf_local;
  
  buf_local.m_ptr = buf.m_ptr;
  _auStack_20 = this;
  iVar2 = span<const_unsigned_int>::size((span<const_unsigned_int> *)auStack_20);
  puVar3 = span<const_unsigned_int>::data((span<const_unsigned_int> *)auStack_20);
  local_34 = 0;
  while( true ) {
    if ((int)iVar2 <= local_34) {
      return (int)iVar2 << 5;
    }
    if (puVar3[local_34] != 0) break;
    local_34 = local_34 + 1;
  }
  v = network_to_host(puVar3[local_34]);
  iVar1 = log2p1(v);
  return (local_34 * 0x20 + 0x1f) - iVar1;
}

Assistant:

int count_leading_zeros_sw(span<std::uint32_t const> buf)
	{
		auto const num = int(buf.size());
		std::uint32_t const* ptr = buf.data();

		TORRENT_ASSERT(num >= 0);
		TORRENT_ASSERT(ptr != nullptr);

		for (int i = 0; i < num; i++)
		{
			if (ptr[i] == 0) continue;
			return i * 32 + 31 - log2p1(aux::network_to_host(ptr[i]));
		}

		return num * 32;
	}